

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  undefined4 uVar11;
  float fVar12;
  undefined4 uVar13;
  Geometry *pGVar14;
  RTCFilterFunctionN p_Var15;
  undefined8 uVar16;
  undefined8 uVar17;
  ulong uVar18;
  byte bVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  ulong uVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong *puVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  ulong unaff_R14;
  size_t mask;
  bool bVar32;
  bool bVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar38 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined8 local_b70;
  undefined8 uStack_b68;
  size_t local_b58;
  ulong local_b50;
  ulong *local_b48;
  Scene *local_b40;
  ulong local_b38;
  undefined1 local_b30 [16];
  undefined1 local_b20 [16];
  undefined1 local_b10 [16];
  undefined1 local_b00 [16];
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [16];
  RTCHitN local_a90 [16];
  undefined1 local_a80 [16];
  undefined1 local_a70 [16];
  undefined1 local_a60 [16];
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  uint local_a20;
  uint uStack_a1c;
  uint uStack_a18;
  uint uStack_a14;
  uint uStack_a10;
  uint uStack_a0c;
  uint uStack_a08;
  uint uStack_a04;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  char local_900;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820;
  size_t local_800;
  ulong local_7f8 [249];
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  local_800 = root.ptr;
  auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar70 = ZEXT1664(auVar35);
  auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar71 = ZEXT1664(auVar35);
  auVar35 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar72 = ZEXT1664(auVar35);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar9 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar7 * 0.99999964)));
  auVar73 = ZEXT1664(auVar35);
  auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar8 * 0.99999964)));
  auVar74 = ZEXT1664(auVar35);
  auVar35 = vbroadcastss_avx512vl(ZEXT416((uint)(fVar9 * 0.99999964)));
  auVar75 = ZEXT1664(auVar35);
  fVar7 = fVar7 * 1.0000004;
  fVar8 = fVar8 * 1.0000004;
  fVar9 = fVar9 * 1.0000004;
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_b38 = uVar25 ^ 0x10;
  iVar10 = (tray->tnear).field_0.i[k];
  auVar35._4_4_ = iVar10;
  auVar35._0_4_ = iVar10;
  auVar35._8_4_ = iVar10;
  auVar35._12_4_ = iVar10;
  iVar10 = (tray->tfar).field_0.i[k];
  auVar69._4_4_ = iVar10;
  auVar69._0_4_ = iVar10;
  auVar69._8_4_ = iVar10;
  auVar69._12_4_ = iVar10;
  local_aa0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  puVar28 = local_7f8;
  do {
    local_b48 = puVar28;
    if (local_b48 == &local_800) break;
    puVar28 = local_b48 + -1;
    uVar27 = local_b48[-1];
    do {
      if ((uVar27 & 8) == 0) {
        auVar36 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar27 + 0x20 + uVar29),auVar70._0_16_);
        auVar36 = vmulps_avx512vl(auVar73._0_16_,auVar36);
        auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar27 + 0x20 + uVar30),auVar71._0_16_);
        auVar37 = vmulps_avx512vl(auVar74._0_16_,auVar37);
        auVar36 = vmaxps_avx(auVar36,auVar37);
        auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar27 + 0x20 + uVar25),auVar72._0_16_);
        auVar37 = vmulps_avx512vl(auVar75._0_16_,auVar37);
        auVar37 = vmaxps_avx(auVar37,auVar35);
        auVar36 = vmaxps_avx(auVar36,auVar37);
        auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar27 + 0x20 + (uVar29 ^ 0x10)),
                                  auVar70._0_16_);
        auVar38._0_4_ = fVar7 * auVar37._0_4_;
        auVar38._4_4_ = fVar7 * auVar37._4_4_;
        auVar38._8_4_ = fVar7 * auVar37._8_4_;
        auVar38._12_4_ = fVar7 * auVar37._12_4_;
        auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar27 + 0x20 + (uVar30 ^ 0x10)),
                                  auVar71._0_16_);
        auVar63._0_4_ = fVar8 * auVar37._0_4_;
        auVar63._4_4_ = fVar8 * auVar37._4_4_;
        auVar63._8_4_ = fVar8 * auVar37._8_4_;
        auVar63._12_4_ = fVar8 * auVar37._12_4_;
        auVar37 = vminps_avx(auVar38,auVar63);
        auVar38 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar27 + 0x20 + local_b38),auVar72._0_16_);
        auVar64._0_4_ = fVar9 * auVar38._0_4_;
        auVar64._4_4_ = fVar9 * auVar38._4_4_;
        auVar64._8_4_ = fVar9 * auVar38._8_4_;
        auVar64._12_4_ = fVar9 * auVar38._12_4_;
        auVar38 = vminps_avx(auVar64,auVar69);
        auVar37 = vminps_avx(auVar37,auVar38);
        uVar16 = vcmpps_avx512vl(auVar36,auVar37,2);
        unaff_R14 = CONCAT44((int)(unaff_R14 >> 0x20),(uint)(byte)uVar16);
      }
      if ((uVar27 & 8) == 0) {
        if (unaff_R14 == 0) {
          uVar31 = 4;
        }
        else {
          uVar26 = uVar27 & 0xfffffffffffffff0;
          lVar24 = 0;
          for (uVar27 = unaff_R14; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
            lVar24 = lVar24 + 1;
          }
          uVar31 = 0;
          for (uVar22 = unaff_R14 - 1 & unaff_R14; uVar27 = *(ulong *)(uVar26 + lVar24 * 8),
              uVar22 != 0; uVar22 = uVar22 - 1 & uVar22) {
            *puVar28 = uVar27;
            puVar28 = puVar28 + 1;
            lVar24 = 0;
            for (uVar27 = uVar22; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
              lVar24 = lVar24 + 1;
            }
          }
        }
      }
      else {
        uVar31 = 6;
      }
    } while (uVar31 == 0);
    if (uVar31 == 6) {
      uVar31 = 0;
      local_b50 = (ulong)((uint)uVar27 & 0xf) - 8;
      bVar32 = local_b50 != 0;
      if (bVar32) {
        uVar27 = uVar27 & 0xfffffffffffffff0;
        uVar26 = 0;
        do {
          lVar23 = uVar26 * 0xe0;
          lVar24 = uVar27 + 0xd0 + lVar23;
          local_a00 = *(undefined8 *)(lVar24 + 0x10);
          uStack_9f8 = *(undefined8 *)(lVar24 + 0x18);
          lVar24 = uVar27 + 0xc0 + lVar23;
          local_9e0 = *(undefined8 *)(lVar24 + 0x10);
          uStack_9d8 = *(undefined8 *)(lVar24 + 0x18);
          uStack_9d0 = local_9e0;
          uStack_9c8 = uStack_9d8;
          uStack_9f0 = local_a00;
          uStack_9e8 = uStack_9f8;
          auVar62._16_16_ = *(undefined1 (*) [16])(uVar27 + 0x60 + lVar23);
          auVar62._0_16_ = *(undefined1 (*) [16])(uVar27 + lVar23);
          auVar42._16_16_ = *(undefined1 (*) [16])(uVar27 + 0x70 + lVar23);
          auVar42._0_16_ = *(undefined1 (*) [16])(uVar27 + 0x10 + lVar23);
          auVar43._16_16_ = *(undefined1 (*) [16])(uVar27 + 0x80 + lVar23);
          auVar43._0_16_ = *(undefined1 (*) [16])(uVar27 + 0x20 + lVar23);
          auVar36 = *(undefined1 (*) [16])(uVar27 + 0x30 + lVar23);
          auVar46._16_16_ = auVar36;
          auVar46._0_16_ = auVar36;
          auVar36 = *(undefined1 (*) [16])(uVar27 + 0x40 + lVar23);
          auVar47._16_16_ = auVar36;
          auVar47._0_16_ = auVar36;
          auVar36 = *(undefined1 (*) [16])(uVar27 + 0x50 + lVar23);
          auVar48._16_16_ = auVar36;
          auVar48._0_16_ = auVar36;
          auVar36 = *(undefined1 (*) [16])(uVar27 + 0x90 + lVar23);
          auVar49._16_16_ = auVar36;
          auVar49._0_16_ = auVar36;
          auVar36 = *(undefined1 (*) [16])(uVar27 + 0xa0 + lVar23);
          auVar50._16_16_ = auVar36;
          auVar50._0_16_ = auVar36;
          auVar36 = *(undefined1 (*) [16])(uVar27 + 0xb0 + lVar23);
          auVar51._16_16_ = auVar36;
          auVar51._0_16_ = auVar36;
          uVar11 = *(undefined4 *)(ray + k * 4);
          auVar52._4_4_ = uVar11;
          auVar52._0_4_ = uVar11;
          auVar52._8_4_ = uVar11;
          auVar52._12_4_ = uVar11;
          auVar52._16_4_ = uVar11;
          auVar52._20_4_ = uVar11;
          auVar52._24_4_ = uVar11;
          auVar52._28_4_ = uVar11;
          auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x10)));
          auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x20)));
          uVar11 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar65._4_4_ = uVar11;
          auVar65._0_4_ = uVar11;
          auVar65._8_4_ = uVar11;
          auVar65._12_4_ = uVar11;
          auVar65._16_4_ = uVar11;
          auVar65._20_4_ = uVar11;
          auVar65._24_4_ = uVar11;
          auVar65._28_4_ = uVar11;
          uVar11 = *(undefined4 *)(ray + k * 4 + 0x50);
          auVar67._4_4_ = uVar11;
          auVar67._0_4_ = uVar11;
          auVar67._8_4_ = uVar11;
          auVar67._12_4_ = uVar11;
          auVar67._16_4_ = uVar11;
          auVar67._20_4_ = uVar11;
          auVar67._24_4_ = uVar11;
          auVar67._28_4_ = uVar11;
          fVar12 = *(float *)(ray + k * 4 + 0x60);
          auVar68._4_4_ = fVar12;
          auVar68._0_4_ = fVar12;
          auVar68._8_4_ = fVar12;
          auVar68._12_4_ = fVar12;
          auVar68._16_4_ = fVar12;
          auVar68._20_4_ = fVar12;
          auVar68._24_4_ = fVar12;
          auVar68._28_4_ = fVar12;
          auVar62 = vsubps_avx(auVar62,auVar52);
          auVar42 = vsubps_avx512vl(auVar42,auVar40);
          auVar43 = vsubps_avx512vl(auVar43,auVar41);
          auVar44 = vsubps_avx512vl(auVar46,auVar52);
          auVar45 = vsubps_avx512vl(auVar47,auVar40);
          auVar46 = vsubps_avx512vl(auVar48,auVar41);
          auVar47 = vsubps_avx512vl(auVar49,auVar52);
          auVar48 = vsubps_avx512vl(auVar50,auVar40);
          auVar41 = vsubps_avx512vl(auVar51,auVar41);
          auVar49 = vsubps_avx512vl(auVar47,auVar62);
          auVar50 = vsubps_avx512vl(auVar48,auVar42);
          auVar40 = vsubps_avx(auVar41,auVar43);
          auVar51 = vsubps_avx512vl(auVar62,auVar44);
          auVar52 = vsubps_avx512vl(auVar42,auVar45);
          auVar53 = vsubps_avx512vl(auVar43,auVar46);
          auVar54 = vsubps_avx512vl(auVar44,auVar47);
          auVar55 = vsubps_avx512vl(auVar45,auVar48);
          auVar56 = vsubps_avx512vl(auVar46,auVar41);
          auVar57 = vaddps_avx512vl(auVar47,auVar62);
          auVar58 = vaddps_avx512vl(auVar48,auVar42);
          auVar59 = vaddps_avx512vl(auVar41,auVar43);
          auVar60 = vmulps_avx512vl(auVar58,auVar40);
          auVar60 = vfmsub231ps_avx512vl(auVar60,auVar50,auVar59);
          auVar59 = vmulps_avx512vl(auVar59,auVar49);
          auVar61 = vfmsub231ps_avx512vl(auVar59,auVar40,auVar57);
          auVar59._4_4_ = auVar50._4_4_ * auVar57._4_4_;
          auVar59._0_4_ = auVar50._0_4_ * auVar57._0_4_;
          auVar59._8_4_ = auVar50._8_4_ * auVar57._8_4_;
          auVar59._12_4_ = auVar50._12_4_ * auVar57._12_4_;
          auVar59._16_4_ = auVar50._16_4_ * auVar57._16_4_;
          auVar59._20_4_ = auVar50._20_4_ * auVar57._20_4_;
          auVar59._24_4_ = auVar50._24_4_ * auVar57._24_4_;
          auVar59._28_4_ = auVar57._28_4_;
          auVar36 = vfmsub231ps_fma(auVar59,auVar49,auVar58);
          auVar58._0_4_ = fVar12 * auVar36._0_4_;
          auVar58._4_4_ = fVar12 * auVar36._4_4_;
          auVar58._8_4_ = fVar12 * auVar36._8_4_;
          auVar58._12_4_ = fVar12 * auVar36._12_4_;
          auVar58._16_4_ = fVar12 * 0.0;
          auVar58._20_4_ = fVar12 * 0.0;
          auVar58._24_4_ = fVar12 * 0.0;
          auVar58._28_4_ = 0;
          auVar59 = vfmadd231ps_avx512vl(auVar58,auVar67,auVar61);
          local_9c0 = vfmadd231ps_avx512vl(auVar59,auVar65,auVar60);
          auVar59 = vaddps_avx512vl(auVar62,auVar44);
          auVar57 = vaddps_avx512vl(auVar42,auVar45);
          auVar58 = vaddps_avx512vl(auVar43,auVar46);
          auVar60 = vmulps_avx512vl(auVar57,auVar53);
          auVar60 = vfmsub231ps_avx512vl(auVar60,auVar52,auVar58);
          auVar58 = vmulps_avx512vl(auVar58,auVar51);
          auVar58 = vfmsub231ps_avx512vl(auVar58,auVar53,auVar59);
          auVar59 = vmulps_avx512vl(auVar59,auVar52);
          auVar59 = vfmsub231ps_avx512vl(auVar59,auVar51,auVar57);
          auVar57._4_4_ = auVar59._4_4_ * fVar12;
          auVar57._0_4_ = auVar59._0_4_ * fVar12;
          auVar57._8_4_ = auVar59._8_4_ * fVar12;
          auVar57._12_4_ = auVar59._12_4_ * fVar12;
          auVar57._16_4_ = auVar59._16_4_ * fVar12;
          auVar57._20_4_ = auVar59._20_4_ * fVar12;
          auVar57._24_4_ = auVar59._24_4_ * fVar12;
          auVar57._28_4_ = auVar59._28_4_;
          auVar59 = vfmadd231ps_avx512vl(auVar57,auVar67,auVar58);
          local_9a0 = vfmadd231ps_avx512vl(auVar59,auVar65,auVar60);
          auVar44 = vaddps_avx512vl(auVar44,auVar47);
          auVar59 = vaddps_avx512vl(auVar45,auVar48);
          auVar41 = vaddps_avx512vl(auVar46,auVar41);
          auVar57 = vmulps_avx512vl(auVar59,auVar56);
          auVar57 = vfmsub231ps_avx512vl(auVar57,auVar55,auVar41);
          auVar45._4_4_ = auVar41._4_4_ * auVar54._4_4_;
          auVar45._0_4_ = auVar41._0_4_ * auVar54._0_4_;
          auVar45._8_4_ = auVar41._8_4_ * auVar54._8_4_;
          auVar45._12_4_ = auVar41._12_4_ * auVar54._12_4_;
          auVar45._16_4_ = auVar41._16_4_ * auVar54._16_4_;
          auVar45._20_4_ = auVar41._20_4_ * auVar54._20_4_;
          auVar45._24_4_ = auVar41._24_4_ * auVar54._24_4_;
          auVar45._28_4_ = auVar41._28_4_;
          auVar41 = vfmsub231ps_avx512vl(auVar45,auVar56,auVar44);
          auVar44 = vmulps_avx512vl(auVar44,auVar55);
          auVar44 = vfmsub231ps_avx512vl(auVar44,auVar54,auVar59);
          auVar44 = vmulps_avx512vl(auVar44,auVar68);
          auVar41 = vfmadd231ps_avx512vl(auVar44,auVar67,auVar41);
          auVar59 = vfmadd231ps_avx512vl(auVar41,auVar65,auVar57);
          auVar60._0_4_ = local_9a0._0_4_ + local_9c0._0_4_;
          auVar60._4_4_ = local_9a0._4_4_ + local_9c0._4_4_;
          auVar60._8_4_ = local_9a0._8_4_ + local_9c0._8_4_;
          auVar60._12_4_ = local_9a0._12_4_ + local_9c0._12_4_;
          auVar60._16_4_ = local_9a0._16_4_ + local_9c0._16_4_;
          auVar60._20_4_ = local_9a0._20_4_ + local_9c0._20_4_;
          auVar60._24_4_ = local_9a0._24_4_ + local_9c0._24_4_;
          auVar60._28_4_ = local_9a0._28_4_ + local_9c0._28_4_;
          local_980 = vaddps_avx512vl(auVar59,auVar60);
          auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(local_980,auVar57);
          auVar41._8_4_ = 0x34000000;
          auVar41._0_8_ = 0x3400000034000000;
          auVar41._12_4_ = 0x34000000;
          auVar41._16_4_ = 0x34000000;
          auVar41._20_4_ = 0x34000000;
          auVar41._24_4_ = 0x34000000;
          auVar41._28_4_ = 0x34000000;
          auVar41 = vmulps_avx512vl(auVar57,auVar41);
          auVar44 = vminps_avx512vl(local_9c0,local_9a0);
          auVar45 = vminps_avx512vl(auVar44,auVar59);
          auVar44._8_4_ = 0x80000000;
          auVar44._0_8_ = 0x8000000080000000;
          auVar44._12_4_ = 0x80000000;
          auVar44._16_4_ = 0x80000000;
          auVar44._20_4_ = 0x80000000;
          auVar44._24_4_ = 0x80000000;
          auVar44._28_4_ = 0x80000000;
          auVar44 = vxorps_avx512vl(auVar41,auVar44);
          uVar16 = vcmpps_avx512vl(auVar45,auVar44,5);
          auVar44 = vmaxps_avx512vl(local_9c0,local_9a0);
          auVar44 = vmaxps_avx512vl(auVar44,auVar59);
          uVar17 = vcmpps_avx512vl(auVar44,auVar41,2);
          bVar19 = (byte)uVar16 | (byte)uVar17;
          if (bVar19 != 0) {
            auVar41 = vmulps_avx512vl(auVar52,auVar40);
            auVar44 = vmulps_avx512vl(auVar49,auVar53);
            auVar59 = vmulps_avx512vl(auVar51,auVar50);
            auVar45 = vmulps_avx512vl(auVar55,auVar53);
            auVar46 = vmulps_avx512vl(auVar51,auVar56);
            auVar47 = vmulps_avx512vl(auVar54,auVar52);
            auVar48 = vfmsub213ps_avx512vl(auVar50,auVar53,auVar41);
            auVar40 = vfmsub213ps_avx512vl(auVar40,auVar51,auVar44);
            auVar49 = vfmsub213ps_avx512vl(auVar49,auVar52,auVar59);
            auVar50 = vfmsub213ps_avx512vl(auVar56,auVar52,auVar45);
            auVar52 = vfmsub213ps_avx512vl(auVar54,auVar53,auVar46);
            auVar51 = vfmsub213ps_avx512vl(auVar55,auVar51,auVar47);
            vandps_avx512vl(auVar41,auVar57);
            vandps_avx512vl(auVar45,auVar57);
            uVar22 = vcmpps_avx512vl(auVar51,auVar51,1);
            vandps_avx512vl(auVar44,auVar57);
            vandps_avx512vl(auVar46,auVar57);
            uVar18 = vcmpps_avx512vl(auVar51,auVar51,1);
            vandps_avx512vl(auVar59,auVar57);
            vandps_avx512vl(auVar47,auVar57);
            uVar34 = vcmpps_avx512vl(auVar51,auVar51,1);
            bVar33 = (bool)((byte)uVar22 & 1);
            local_960._0_4_ = (float)((uint)bVar33 * auVar48._0_4_ | (uint)!bVar33 * auVar50._0_4_);
            bVar33 = (bool)((byte)(uVar22 >> 1) & 1);
            local_960._4_4_ = (float)((uint)bVar33 * auVar48._4_4_ | (uint)!bVar33 * auVar50._4_4_);
            bVar33 = (bool)((byte)(uVar22 >> 2) & 1);
            local_960._8_4_ = (float)((uint)bVar33 * auVar48._8_4_ | (uint)!bVar33 * auVar50._8_4_);
            bVar33 = (bool)((byte)(uVar22 >> 3) & 1);
            local_960._12_4_ =
                 (float)((uint)bVar33 * auVar48._12_4_ | (uint)!bVar33 * auVar50._12_4_);
            bVar33 = (bool)((byte)(uVar22 >> 4) & 1);
            local_960._16_4_ =
                 (float)((uint)bVar33 * auVar48._16_4_ | (uint)!bVar33 * auVar50._16_4_);
            bVar33 = (bool)((byte)(uVar22 >> 5) & 1);
            local_960._20_4_ =
                 (float)((uint)bVar33 * auVar48._20_4_ | (uint)!bVar33 * auVar50._20_4_);
            bVar33 = (bool)((byte)(uVar22 >> 6) & 1);
            local_960._24_4_ =
                 (float)((uint)bVar33 * auVar48._24_4_ | (uint)!bVar33 * auVar50._24_4_);
            bVar33 = SUB81(uVar22 >> 7,0);
            local_960._28_4_ = (uint)bVar33 * auVar48._28_4_ | (uint)!bVar33 * auVar50._28_4_;
            bVar33 = (bool)((byte)uVar18 & 1);
            local_940._0_4_ = (float)((uint)bVar33 * auVar40._0_4_ | (uint)!bVar33 * auVar52._0_4_);
            bVar33 = (bool)((byte)(uVar18 >> 1) & 1);
            local_940._4_4_ = (float)((uint)bVar33 * auVar40._4_4_ | (uint)!bVar33 * auVar52._4_4_);
            bVar33 = (bool)((byte)(uVar18 >> 2) & 1);
            local_940._8_4_ = (float)((uint)bVar33 * auVar40._8_4_ | (uint)!bVar33 * auVar52._8_4_);
            bVar33 = (bool)((byte)(uVar18 >> 3) & 1);
            local_940._12_4_ =
                 (float)((uint)bVar33 * auVar40._12_4_ | (uint)!bVar33 * auVar52._12_4_);
            bVar33 = (bool)((byte)(uVar18 >> 4) & 1);
            local_940._16_4_ =
                 (float)((uint)bVar33 * auVar40._16_4_ | (uint)!bVar33 * auVar52._16_4_);
            bVar33 = (bool)((byte)(uVar18 >> 5) & 1);
            local_940._20_4_ =
                 (float)((uint)bVar33 * auVar40._20_4_ | (uint)!bVar33 * auVar52._20_4_);
            bVar33 = (bool)((byte)(uVar18 >> 6) & 1);
            local_940._24_4_ =
                 (float)((uint)bVar33 * auVar40._24_4_ | (uint)!bVar33 * auVar52._24_4_);
            bVar33 = SUB81(uVar18 >> 7,0);
            local_940._28_4_ = (uint)bVar33 * auVar40._28_4_ | (uint)!bVar33 * auVar52._28_4_;
            bVar33 = (bool)((byte)uVar34 & 1);
            local_920._0_4_ = (float)((uint)bVar33 * auVar49._0_4_ | (uint)!bVar33 * auVar51._0_4_);
            bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
            local_920._4_4_ = (float)((uint)bVar33 * auVar49._4_4_ | (uint)!bVar33 * auVar51._4_4_);
            bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
            local_920._8_4_ = (float)((uint)bVar33 * auVar49._8_4_ | (uint)!bVar33 * auVar51._8_4_);
            bVar33 = (bool)((byte)(uVar34 >> 3) & 1);
            local_920._12_4_ =
                 (float)((uint)bVar33 * auVar49._12_4_ | (uint)!bVar33 * auVar51._12_4_);
            bVar33 = (bool)((byte)(uVar34 >> 4) & 1);
            local_920._16_4_ =
                 (float)((uint)bVar33 * auVar49._16_4_ | (uint)!bVar33 * auVar51._16_4_);
            bVar33 = (bool)((byte)(uVar34 >> 5) & 1);
            local_920._20_4_ =
                 (float)((uint)bVar33 * auVar49._20_4_ | (uint)!bVar33 * auVar51._20_4_);
            bVar33 = (bool)((byte)(uVar34 >> 6) & 1);
            local_920._24_4_ =
                 (float)((uint)bVar33 * auVar49._24_4_ | (uint)!bVar33 * auVar51._24_4_);
            bVar33 = SUB81(uVar34 >> 7,0);
            local_920._28_4_ = (uint)bVar33 * auVar49._28_4_ | (uint)!bVar33 * auVar51._28_4_;
            auVar55._4_4_ = fVar12 * local_920._4_4_;
            auVar55._0_4_ = fVar12 * local_920._0_4_;
            auVar55._8_4_ = fVar12 * local_920._8_4_;
            auVar55._12_4_ = fVar12 * local_920._12_4_;
            auVar55._16_4_ = fVar12 * local_920._16_4_;
            auVar55._20_4_ = fVar12 * local_920._20_4_;
            auVar55._24_4_ = fVar12 * local_920._24_4_;
            auVar55._28_4_ = fVar12;
            auVar36 = vfmadd213ps_fma(auVar67,local_940,auVar55);
            auVar36 = vfmadd213ps_fma(auVar65,local_960,ZEXT1632(auVar36));
            auVar41 = ZEXT1632(CONCAT412(auVar36._12_4_ + auVar36._12_4_,
                                         CONCAT48(auVar36._8_4_ + auVar36._8_4_,
                                                  CONCAT44(auVar36._4_4_ + auVar36._4_4_,
                                                           auVar36._0_4_ + auVar36._0_4_))));
            auVar56._0_4_ = auVar43._0_4_ * local_920._0_4_;
            auVar56._4_4_ = auVar43._4_4_ * local_920._4_4_;
            auVar56._8_4_ = auVar43._8_4_ * local_920._8_4_;
            auVar56._12_4_ = auVar43._12_4_ * local_920._12_4_;
            auVar56._16_4_ = auVar43._16_4_ * local_920._16_4_;
            auVar56._20_4_ = auVar43._20_4_ * local_920._20_4_;
            auVar56._24_4_ = auVar43._24_4_ * local_920._24_4_;
            auVar56._28_4_ = 0;
            auVar36 = vfmadd213ps_fma(auVar42,local_940,auVar56);
            auVar37 = vfmadd213ps_fma(auVar62,local_960,ZEXT1632(auVar36));
            auVar62 = vrcp14ps_avx512vl(auVar41);
            auVar40._8_4_ = 0x3f800000;
            auVar40._0_8_ = &DAT_3f8000003f800000;
            auVar40._12_4_ = 0x3f800000;
            auVar40._16_4_ = 0x3f800000;
            auVar40._20_4_ = 0x3f800000;
            auVar40._24_4_ = 0x3f800000;
            auVar40._28_4_ = 0x3f800000;
            auVar40 = vfnmadd213ps_avx512vl(auVar62,auVar41,auVar40);
            auVar36 = vfmadd132ps_fma(auVar40,auVar62,auVar62);
            local_8a0 = ZEXT1632(CONCAT412((auVar37._12_4_ + auVar37._12_4_) * auVar36._12_4_,
                                           CONCAT48((auVar37._8_4_ + auVar37._8_4_) * auVar36._8_4_,
                                                    CONCAT44((auVar37._4_4_ + auVar37._4_4_) *
                                                             auVar36._4_4_,
                                                             (auVar37._0_4_ + auVar37._0_4_) *
                                                             auVar36._0_4_))));
            uVar11 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar53._4_4_ = uVar11;
            auVar53._0_4_ = uVar11;
            auVar53._8_4_ = uVar11;
            auVar53._12_4_ = uVar11;
            auVar53._16_4_ = uVar11;
            auVar53._20_4_ = uVar11;
            auVar53._24_4_ = uVar11;
            auVar53._28_4_ = uVar11;
            uVar16 = vcmpps_avx512vl(local_8a0,auVar53,0xd);
            uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar54._4_4_ = uVar11;
            auVar54._0_4_ = uVar11;
            auVar54._8_4_ = uVar11;
            auVar54._12_4_ = uVar11;
            auVar54._16_4_ = uVar11;
            auVar54._20_4_ = uVar11;
            auVar54._24_4_ = uVar11;
            auVar54._28_4_ = uVar11;
            uVar17 = vcmpps_avx512vl(local_8a0,auVar54,2);
            bVar19 = (byte)uVar16 & (byte)uVar17 & bVar19;
            if (bVar19 != 0) {
              uVar22 = vcmpps_avx512vl(auVar41,_DAT_02020f00,4);
              uVar22 = bVar19 & uVar22;
              if ((char)uVar22 != '\0') {
                local_900 = (char)uVar22;
                local_820 = 0xf0;
                local_b40 = context->scene;
                auVar61._8_4_ = 0x219392ef;
                auVar61._0_8_ = 0x219392ef219392ef;
                auVar61._12_4_ = 0x219392ef;
                auVar61._16_4_ = 0x219392ef;
                auVar61._20_4_ = 0x219392ef;
                auVar61._24_4_ = 0x219392ef;
                auVar61._28_4_ = 0x219392ef;
                uVar18 = vcmpps_avx512vl(auVar57,auVar61,5);
                auVar40 = vrcp14ps_avx512vl(local_980);
                auVar66._8_4_ = 0x3f800000;
                auVar66._0_8_ = &DAT_3f8000003f800000;
                auVar66._12_4_ = 0x3f800000;
                auVar66._16_4_ = 0x3f800000;
                auVar66._20_4_ = 0x3f800000;
                auVar66._24_4_ = 0x3f800000;
                auVar66._28_4_ = 0x3f800000;
                auVar36 = vfnmadd213ps_fma(local_980,auVar40,auVar66);
                auVar62 = vfmadd132ps_avx512vl(ZEXT1632(auVar36),auVar40,auVar40);
                fVar1 = (float)((uint)((byte)uVar18 & 1) * auVar62._0_4_);
                fVar12 = (float)((uint)((byte)(uVar18 >> 1) & 1) * auVar62._4_4_);
                fVar2 = (float)((uint)((byte)(uVar18 >> 2) & 1) * auVar62._8_4_);
                fVar3 = (float)((uint)((byte)(uVar18 >> 3) & 1) * auVar62._12_4_);
                fVar4 = (float)((uint)((byte)(uVar18 >> 4) & 1) * auVar62._16_4_);
                fVar5 = (float)((uint)((byte)(uVar18 >> 5) & 1) * auVar62._20_4_);
                fVar6 = (float)((uint)((byte)(uVar18 >> 6) & 1) * auVar62._24_4_);
                auVar20._4_4_ = fVar12 * local_9c0._4_4_;
                auVar20._0_4_ = fVar1 * local_9c0._0_4_;
                auVar20._8_4_ = fVar2 * local_9c0._8_4_;
                auVar20._12_4_ = fVar3 * local_9c0._12_4_;
                auVar20._16_4_ = fVar4 * local_9c0._16_4_;
                auVar20._20_4_ = fVar5 * local_9c0._20_4_;
                auVar20._24_4_ = fVar6 * local_9c0._24_4_;
                auVar20._28_4_ = local_9c0._28_4_;
                auVar62 = vminps_avx(auVar20,auVar66);
                auVar21._4_4_ = local_9a0._4_4_ * fVar12;
                auVar21._0_4_ = local_9a0._0_4_ * fVar1;
                auVar21._8_4_ = local_9a0._8_4_ * fVar2;
                auVar21._12_4_ = local_9a0._12_4_ * fVar3;
                auVar21._16_4_ = local_9a0._16_4_ * fVar4;
                auVar21._20_4_ = local_9a0._20_4_ * fVar5;
                auVar21._24_4_ = local_9a0._24_4_ * fVar6;
                auVar21._28_4_ = auVar40._28_4_;
                auVar40 = vminps_avx(auVar21,auVar66);
                auVar41 = vsubps_avx(auVar66,auVar62);
                auVar44 = vsubps_avx(auVar66,auVar40);
                local_8c0 = vblendps_avx(auVar40,auVar41,0xf0);
                local_8e0 = vblendps_avx(auVar62,auVar44,0xf0);
                fVar12 = (float)DAT_02060940;
                fVar6 = DAT_02060940._4_4_;
                local_880._4_4_ = local_960._4_4_ * fVar6;
                local_880._0_4_ = local_960._0_4_ * fVar12;
                fVar5 = DAT_02060940._8_4_;
                local_880._8_4_ = local_960._8_4_ * fVar5;
                fVar4 = DAT_02060940._12_4_;
                local_880._12_4_ = local_960._12_4_ * fVar4;
                fVar3 = DAT_02060940._16_4_;
                local_880._16_4_ = local_960._16_4_ * fVar3;
                fVar2 = DAT_02060940._20_4_;
                local_880._20_4_ = local_960._20_4_ * fVar2;
                fVar1 = DAT_02060940._24_4_;
                local_880._24_4_ = local_960._24_4_ * fVar1;
                local_880._28_4_ = local_960._28_4_;
                local_860._4_4_ = local_940._4_4_ * fVar6;
                local_860._0_4_ = local_940._0_4_ * fVar12;
                local_860._8_4_ = local_940._8_4_ * fVar5;
                local_860._12_4_ = local_940._12_4_ * fVar4;
                local_860._16_4_ = local_940._16_4_ * fVar3;
                local_860._20_4_ = local_940._20_4_ * fVar2;
                local_860._24_4_ = local_940._24_4_ * fVar1;
                local_860._28_4_ = local_940._28_4_;
                local_840._4_4_ = local_920._4_4_ * fVar6;
                local_840._0_4_ = local_920._0_4_ * fVar12;
                local_840._8_4_ = local_920._8_4_ * fVar5;
                local_840._12_4_ = local_920._12_4_ * fVar4;
                local_840._16_4_ = local_920._16_4_ * fVar3;
                local_840._20_4_ = local_920._20_4_ * fVar2;
                local_840._24_4_ = local_920._24_4_ * fVar1;
                local_840._28_4_ = local_920._28_4_;
                do {
                  local_ae0 = auVar70._0_16_;
                  local_af0 = auVar71._0_16_;
                  local_b00 = auVar72._0_16_;
                  local_b10 = auVar73._0_16_;
                  local_b20 = auVar74._0_16_;
                  local_b30 = auVar75._0_16_;
                  uVar18 = 0;
                  for (uVar34 = uVar22; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000
                      ) {
                    uVar18 = uVar18 + 1;
                  }
                  pGVar14 = (local_b40->geometries).items[*(uint *)((long)&local_9e0 + uVar18 * 4)].
                            ptr;
                  if ((pGVar14->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    uVar22 = uVar22 ^ 1L << (uVar18 & 0x3f);
                    bVar33 = true;
                  }
                  else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                          (pGVar14->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar33 = false;
                  }
                  else {
                    uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
                    uVar34 = (ulong)(uint)((int)uVar18 * 4);
                    uVar13 = *(undefined4 *)(local_8e0 + uVar34);
                    local_a60._4_4_ = uVar13;
                    local_a60._0_4_ = uVar13;
                    local_a60._8_4_ = uVar13;
                    local_a60._12_4_ = uVar13;
                    uVar13 = *(undefined4 *)(local_8c0 + uVar34);
                    local_a50._4_4_ = uVar13;
                    local_a50._0_4_ = uVar13;
                    local_a50._8_4_ = uVar13;
                    local_a50._12_4_ = uVar13;
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_8a0 + uVar34);
                    local_ad0.context = context->user;
                    local_a30 = vpbroadcastd_avx512vl();
                    uVar13 = *(undefined4 *)((long)&local_a00 + uVar34);
                    local_a40._4_4_ = uVar13;
                    local_a40._0_4_ = uVar13;
                    local_a40._8_4_ = uVar13;
                    local_a40._12_4_ = uVar13;
                    uVar13 = *(undefined4 *)(local_880 + uVar34);
                    local_a90._4_4_ = uVar13;
                    local_a90._0_4_ = uVar13;
                    local_a90._8_4_ = uVar13;
                    local_a90._12_4_ = uVar13;
                    uVar13 = *(undefined4 *)(local_860 + uVar34);
                    local_a80._4_4_ = uVar13;
                    local_a80._0_4_ = uVar13;
                    local_a80._8_4_ = uVar13;
                    local_a80._12_4_ = uVar13;
                    uVar13 = *(undefined4 *)(local_840 + uVar34);
                    local_a70._4_4_ = uVar13;
                    local_a70._0_4_ = uVar13;
                    local_a70._8_4_ = uVar13;
                    local_a70._12_4_ = uVar13;
                    vpcmpeqd_avx2(ZEXT1632(local_a30),ZEXT1632(local_a30));
                    uStack_a1c = (local_ad0.context)->instID[0];
                    local_a20 = uStack_a1c;
                    uStack_a18 = uStack_a1c;
                    uStack_a14 = uStack_a1c;
                    uStack_a10 = (local_ad0.context)->instPrimID[0];
                    uStack_a0c = uStack_a10;
                    uStack_a08 = uStack_a10;
                    uStack_a04 = uStack_a10;
                    local_b70 = local_aa0._0_8_;
                    uStack_b68 = local_aa0._8_8_;
                    local_ad0.valid = (int *)&local_b70;
                    local_ad0.geometryUserPtr = pGVar14->userPtr;
                    local_ad0.hit = local_a90;
                    local_ad0.N = 4;
                    local_ad0.ray = (RTCRayN *)ray;
                    if (pGVar14->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      local_b58 = k;
                      (*pGVar14->occlusionFilterN)(&local_ad0);
                      auVar75 = ZEXT1664(local_b30);
                      auVar74 = ZEXT1664(local_b20);
                      auVar73 = ZEXT1664(local_b10);
                      auVar72 = ZEXT1664(local_b00);
                      auVar71 = ZEXT1664(local_af0);
                      auVar70 = ZEXT1664(local_ae0);
                      k = local_b58;
                    }
                    auVar36._8_8_ = uStack_b68;
                    auVar36._0_8_ = local_b70;
                    uVar34 = vptestmd_avx512vl(auVar36,auVar36);
                    if ((uVar34 & 0xf) == 0) {
                      bVar33 = true;
                    }
                    else {
                      p_Var15 = context->args->filter;
                      if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar14->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var15)(&local_ad0);
                        auVar75 = ZEXT1664(local_b30);
                        auVar74 = ZEXT1664(local_b20);
                        auVar73 = ZEXT1664(local_b10);
                        auVar72 = ZEXT1664(local_b00);
                        auVar71 = ZEXT1664(local_af0);
                        auVar70 = ZEXT1664(local_ae0);
                      }
                      auVar37._8_8_ = uStack_b68;
                      auVar37._0_8_ = local_b70;
                      uVar34 = vptestmd_avx512vl(auVar37,auVar37);
                      uVar34 = uVar34 & 0xf;
                      auVar36 = *(undefined1 (*) [16])(local_ad0.ray + 0x80);
                      auVar37 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                      bVar33 = (bool)((byte)uVar34 & 1);
                      auVar39._0_4_ = (uint)bVar33 * auVar37._0_4_ | (uint)!bVar33 * auVar36._0_4_;
                      bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
                      auVar39._4_4_ = (uint)bVar33 * auVar37._4_4_ | (uint)!bVar33 * auVar36._4_4_;
                      bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
                      auVar39._8_4_ = (uint)bVar33 * auVar37._8_4_ | (uint)!bVar33 * auVar36._8_4_;
                      bVar33 = SUB81(uVar34 >> 3,0);
                      auVar39._12_4_ =
                           (uint)bVar33 * auVar37._12_4_ | (uint)!bVar33 * auVar36._12_4_;
                      *(undefined1 (*) [16])(local_ad0.ray + 0x80) = auVar39;
                      bVar33 = (byte)uVar34 == 0;
                    }
                    if (bVar33) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar11;
                      uVar22 = uVar22 ^ 1L << (uVar18 & 0x3f);
                    }
                  }
                  uVar31 = 0;
                  if (!bVar33) {
                    if (bVar32) {
                      *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                      uVar31 = 1;
                    }
                    goto LAB_0077a2cb;
                  }
                } while (uVar22 != 0);
              }
            }
          }
          uVar31 = 0;
          uVar26 = uVar26 + 1;
          bVar32 = uVar26 < local_b50;
        } while (uVar26 != local_b50);
      }
    }
LAB_0077a2cb:
  } while ((uVar31 & 3) == 0);
  return local_b48 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }